

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes__sort_points(par_shapes_mesh *mesh,int gridsize,uint16_t *sortmap)

{
  float *pfVar1;
  void *__src;
  float *pfVar2;
  uint16_t *puVar3;
  float *pfVar4;
  long *in_FS_OFFSET;
  int local_12c;
  ushort *puStack_128;
  int i_2;
  uint16_t *srcind;
  uint16_t *dstind;
  uint16_t *newinds;
  float *srcpt;
  float *pfStack_a0;
  int i_1;
  float *dstpt;
  uint16_t *invmap;
  float *newpts;
  int i;
  uint16_t *sortmap_local;
  int gridsize_local;
  par_shapes_mesh *mesh_local;
  
  for (newpts._4_4_ = 0; newpts._4_4_ < mesh->npoints; newpts._4_4_ = newpts._4_4_ + 1) {
    sortmap[newpts._4_4_] = (uint16_t)newpts._4_4_;
  }
  par_shapes__sort_context.points = mesh->points;
  par_shapes__sort_context.gridsize = gridsize;
  qsort(sortmap,(long)mesh->npoints,2,par_shapes__cmp1);
  pfVar1 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  __src = (void *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  pfStack_a0 = pfVar1;
  for (srcpt._4_4_ = 0; srcpt._4_4_ < mesh->npoints; srcpt._4_4_ = srcpt._4_4_ + 1) {
    *(short *)((long)__src + (ulong)sortmap[srcpt._4_4_] * 2) = (short)srcpt._4_4_;
    pfVar2 = mesh->points + (int)((uint)sortmap[srcpt._4_4_] * 3);
    *pfStack_a0 = *pfVar2;
    pfVar4 = pfStack_a0 + 2;
    pfStack_a0[1] = pfVar2[1];
    pfStack_a0 = pfStack_a0 + 3;
    *pfVar4 = pfVar2[2];
  }
  (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
  mesh->points = pfVar1;
  puVar3 = (uint16_t *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  puStack_128 = mesh->triangles;
  srcind = puVar3;
  for (local_12c = 0;
      SBORROW4(local_12c,mesh->ntriangles * 3) != local_12c + mesh->ntriangles * -3 < 0;
      local_12c = local_12c + 1) {
    *srcind = *(uint16_t *)((long)__src + (ulong)*puStack_128 * 2);
    puStack_128 = puStack_128 + 1;
    srcind = srcind + 1;
  }
  (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
  mesh->triangles = puVar3;
  memcpy(sortmap,__src,(long)mesh->npoints << 1);
  (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
  return;
}

Assistant:

static void par_shapes__sort_points(par_shapes_mesh* mesh, int gridsize,
                                    PAR_SHAPES_T* sortmap)
{
    // Run qsort over a list of consecutive integers that get deferenced
    // within the comparator function; this creates a reorder mapping.
    for (int i = 0; i < mesh->npoints; i++) {
        sortmap[i] = i;
    }
    par_shapes__sort_context.gridsize = gridsize;
    par_shapes__sort_context.points = mesh->points;
    qsort(sortmap, mesh->npoints, sizeof(PAR_SHAPES_T), par_shapes__cmp1);

    // Apply the reorder mapping to the XYZ coordinate data.
    float* newpts = PAR_MALLOC(float, mesh->npoints * 3);
    PAR_SHAPES_T* invmap = PAR_MALLOC(PAR_SHAPES_T, mesh->npoints);
    float* dstpt = newpts;
    for (int i = 0; i < mesh->npoints; i++) {
        invmap[sortmap[i]] = i;
        float const* srcpt = mesh->points + 3 * sortmap[i];
        *dstpt++ = *srcpt++;
        *dstpt++ = *srcpt++;
        *dstpt++ = *srcpt++;
    }
    PAR_FREE(mesh->points);
    mesh->points = newpts;

    // Apply the inverse reorder mapping to the triangle indices.
    PAR_SHAPES_T* newinds = PAR_MALLOC(PAR_SHAPES_T, mesh->ntriangles * 3);
    PAR_SHAPES_T* dstind = newinds;
    PAR_SHAPES_T const* srcind = mesh->triangles;
    for (int i = 0; i < mesh->ntriangles * 3; i++) {
        *dstind++ = invmap[*srcind++];
    }
    PAR_FREE(mesh->triangles);
    mesh->triangles = newinds;

    // Cleanup.
    memcpy(sortmap, invmap, sizeof(PAR_SHAPES_T) * mesh->npoints);
    PAR_FREE(invmap);
}